

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  vfloat<4> vVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  vbool<4> vVar26;
  uint uVar27;
  int iVar28;
  undefined4 uVar29;
  long lVar30;
  ulong uVar31;
  NodeRef root;
  size_t sVar32;
  size_t sVar33;
  uint uVar34;
  ulong uVar35;
  NodeRef *pNVar36;
  ulong uVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar38;
  bool bVar39;
  float fVar40;
  float fVar44;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 in_ZMM0 [64];
  float fVar45;
  float fVar61;
  float fVar62;
  vint4 ai_2;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  vint4 bi;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 bi_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 bi_3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar82;
  float fVar83;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  undefined1 auVar81 [16];
  vint4 ai;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar95;
  float fVar96;
  vint4 ai_1;
  undefined1 auVar93 [16];
  float fVar97;
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  vint4 ai_3;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar103;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  undefined1 auVar104 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_1958 [16];
  BVH *local_1948;
  Intersectors *local_1940;
  undefined1 local_1938 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_false> tray;
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [8];
  float fStack_17b0;
  float fStack_17ac;
  undefined1 local_17a8 [8];
  float fStack_17a0;
  float fStack_179c;
  undefined1 local_1798 [8];
  float fStack_1790;
  float fStack_178c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  undefined1 auStack_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar25 = mm_lookupmask_ps._8_8_;
  uVar24 = mm_lookupmask_ps._0_8_;
  local_1948 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1948->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar52 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar58 = vpcmpeqd_avx(auVar52,(undefined1  [16])valid_i->field_0);
    auVar53 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53,5);
    auVar41 = auVar58 & auVar8;
    if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar58);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar98._8_4_ = 0x7fffffff;
      auVar98._0_8_ = 0x7fffffff7fffffff;
      auVar98._12_4_ = 0x7fffffff;
      auVar58 = vandps_avx(auVar98,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar90._8_4_ = 0x219392ef;
      auVar90._0_8_ = 0x219392ef219392ef;
      auVar90._12_4_ = 0x219392ef;
      auVar58 = vcmpps_avx(auVar58,auVar90,1);
      auVar41 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar90,auVar58);
      auVar58 = vandps_avx(auVar98,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar58 = vcmpps_avx(auVar58,auVar90,1);
      auVar79 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar90,auVar58);
      auVar58 = vandps_avx(auVar98,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar58 = vcmpps_avx(auVar58,auVar90,1);
      auVar58 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar90,auVar58);
      auVar73 = vrcpps_avx(auVar41);
      fVar45 = auVar73._0_4_;
      auVar69._0_4_ = auVar41._0_4_ * fVar45;
      fVar61 = auVar73._4_4_;
      auVar69._4_4_ = auVar41._4_4_ * fVar61;
      fVar62 = auVar73._8_4_;
      auVar69._8_4_ = auVar41._8_4_ * fVar62;
      fVar63 = auVar73._12_4_;
      auVar69._12_4_ = auVar41._12_4_ * fVar63;
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar41 = vsubps_avx(auVar91,auVar69);
      tray.rdir.field_0._0_4_ = fVar45 + fVar45 * auVar41._0_4_;
      tray.rdir.field_0._4_4_ = fVar61 + fVar61 * auVar41._4_4_;
      tray.rdir.field_0._8_4_ = fVar62 + fVar62 * auVar41._8_4_;
      tray.rdir.field_0._12_4_ = fVar63 + fVar63 * auVar41._12_4_;
      auVar41 = vrcpps_avx(auVar79);
      fVar45 = auVar41._0_4_;
      auVar73._0_4_ = auVar79._0_4_ * fVar45;
      fVar61 = auVar41._4_4_;
      auVar73._4_4_ = auVar79._4_4_ * fVar61;
      fVar62 = auVar41._8_4_;
      auVar73._8_4_ = auVar79._8_4_ * fVar62;
      fVar63 = auVar41._12_4_;
      auVar73._12_4_ = auVar79._12_4_ * fVar63;
      auVar41 = vsubps_avx(auVar91,auVar73);
      tray.rdir.field_0._16_4_ = fVar45 + fVar45 * auVar41._0_4_;
      tray.rdir.field_0._20_4_ = fVar61 + fVar61 * auVar41._4_4_;
      tray.rdir.field_0._24_4_ = fVar62 + fVar62 * auVar41._8_4_;
      tray.rdir.field_0._28_4_ = fVar63 + fVar63 * auVar41._12_4_;
      auVar41 = vrcpps_avx(auVar58);
      fVar45 = auVar41._0_4_;
      auVar79._0_4_ = auVar58._0_4_ * fVar45;
      fVar61 = auVar41._4_4_;
      auVar79._4_4_ = auVar58._4_4_ * fVar61;
      fVar62 = auVar41._8_4_;
      auVar79._8_4_ = auVar58._8_4_ * fVar62;
      fVar63 = auVar41._12_4_;
      auVar79._12_4_ = auVar58._12_4_ * fVar63;
      auVar58 = vsubps_avx(auVar91,auVar79);
      tray.rdir.field_0._32_4_ = fVar45 + fVar45 * auVar58._0_4_;
      tray.rdir.field_0._36_4_ = fVar61 + fVar61 * auVar58._4_4_;
      tray.rdir.field_0._40_4_ = fVar62 + fVar62 * auVar58._8_4_;
      tray.rdir.field_0._44_4_ = fVar63 + fVar63 * auVar58._12_4_;
      auVar58 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar53,1);
      auVar85._8_4_ = 0x10;
      auVar85._0_8_ = 0x1000000010;
      auVar85._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar58,auVar85);
      auVar58 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar53,5);
      auVar41._8_4_ = 0x20;
      auVar41._0_8_ = 0x2000000020;
      auVar41._12_4_ = 0x20;
      auVar86._8_4_ = 0x30;
      auVar86._0_8_ = 0x3000000030;
      auVar86._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar86,auVar41,auVar58);
      auVar58 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar53,5);
      auVar80._8_4_ = 0x40;
      auVar80._0_8_ = 0x4000000040;
      auVar80._12_4_ = 0x40;
      auVar87._8_4_ = 0x50;
      auVar87._0_8_ = 0x5000000050;
      auVar87._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar87,auVar80,auVar58);
      auVar58 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar53);
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar104 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar58,auVar8);
      auVar58._8_4_ = 0xff800000;
      auVar58._0_8_ = 0xff800000ff800000;
      auVar58._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar58,auVar41,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar52._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar52._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar52._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar52._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar38 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar52 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
      auVar108 = ZEXT1664(auVar52);
      local_1940 = This;
LAB_01519c16:
      do {
        do {
          root.ptr = pNVar36[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0151a563;
          pNVar36 = pNVar36 + -1;
          paVar38 = paVar38 + -1;
          vVar4.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar38->v;
          auVar60 = ZEXT1664((undefined1  [16])vVar4.field_0);
          auVar52 = vcmpps_avx((undefined1  [16])vVar4.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar27 = vmovmskps_avx(auVar52);
        } while (uVar27 == 0);
        uVar37 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        if (uVar34 < uVar27) {
LAB_01519c56:
          do {
            vVar26.field_0 = terminated.field_0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0151a563;
              auVar52 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar60._0_16_,6);
              if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar52[0xf]) goto LAB_01519c16;
              uVar37 = (ulong)((uint)root.ptr & 0xf);
              if (uVar37 == 8) goto LAB_0151a460;
              auVar53._0_4_ = auVar108._0_4_ ^ terminated.field_0._0_4_;
              auVar53._4_4_ = auVar108._4_4_ ^ terminated.field_0._4_4_;
              auVar53._8_4_ = auVar108._8_4_ ^ terminated.field_0._8_4_;
              auVar53._12_4_ = auVar108._12_4_ ^ terminated.field_0._12_4_;
              lVar30 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar35 = 0;
              goto LAB_01519e4d;
            }
            lVar30 = 0;
            sVar33 = 8;
            auVar52 = auVar104._0_16_;
            do {
              sVar32 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar30 * 8);
              if (sVar32 == 8) {
                auVar60 = ZEXT1664(auVar52);
                sVar32 = sVar33;
                break;
              }
              uVar29 = *(undefined4 *)(root.ptr + 0x20 + lVar30 * 4);
              auVar46._4_4_ = uVar29;
              auVar46._0_4_ = uVar29;
              auVar46._8_4_ = uVar29;
              auVar46._12_4_ = uVar29;
              auVar21._8_8_ = tray.org.field_0._8_8_;
              auVar21._0_8_ = tray.org.field_0._0_8_;
              auVar22._8_8_ = tray.org.field_0._24_8_;
              auVar22._0_8_ = tray.org.field_0._16_8_;
              auVar23._8_8_ = tray.org.field_0._40_8_;
              auVar23._0_8_ = tray.org.field_0._32_8_;
              auVar58 = vsubps_avx(auVar46,auVar21);
              auVar88._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar58._0_4_;
              auVar88._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar58._4_4_;
              auVar88._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar58._8_4_;
              auVar88._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar58._12_4_;
              uVar29 = *(undefined4 *)(root.ptr + 0x40 + lVar30 * 4);
              auVar47._4_4_ = uVar29;
              auVar47._0_4_ = uVar29;
              auVar47._8_4_ = uVar29;
              auVar47._12_4_ = uVar29;
              auVar58 = vsubps_avx(auVar47,auVar22);
              auVar93._0_4_ = tray.rdir.field_0._16_4_ * auVar58._0_4_;
              auVar93._4_4_ = tray.rdir.field_0._20_4_ * auVar58._4_4_;
              auVar93._8_4_ = tray.rdir.field_0._24_4_ * auVar58._8_4_;
              auVar93._12_4_ = tray.rdir.field_0._28_4_ * auVar58._12_4_;
              uVar29 = *(undefined4 *)(root.ptr + 0x60 + lVar30 * 4);
              auVar48._4_4_ = uVar29;
              auVar48._0_4_ = uVar29;
              auVar48._8_4_ = uVar29;
              auVar48._12_4_ = uVar29;
              auVar58 = vsubps_avx(auVar48,auVar23);
              auVar101._0_4_ = tray.rdir.field_0._32_4_ * auVar58._0_4_;
              auVar101._4_4_ = tray.rdir.field_0._36_4_ * auVar58._4_4_;
              auVar101._8_4_ = tray.rdir.field_0._40_4_ * auVar58._8_4_;
              auVar101._12_4_ = tray.rdir.field_0._44_4_ * auVar58._12_4_;
              uVar29 = *(undefined4 *)(root.ptr + 0x30 + lVar30 * 4);
              auVar49._4_4_ = uVar29;
              auVar49._0_4_ = uVar29;
              auVar49._8_4_ = uVar29;
              auVar49._12_4_ = uVar29;
              auVar58 = vsubps_avx(auVar49,auVar21);
              auVar64._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar58._0_4_;
              auVar64._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar58._4_4_;
              auVar64._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar58._8_4_;
              auVar64._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar58._12_4_;
              uVar29 = *(undefined4 *)(root.ptr + 0x50 + lVar30 * 4);
              auVar50._4_4_ = uVar29;
              auVar50._0_4_ = uVar29;
              auVar50._8_4_ = uVar29;
              auVar50._12_4_ = uVar29;
              auVar58 = vsubps_avx(auVar50,auVar22);
              auVar70._0_4_ = tray.rdir.field_0._16_4_ * auVar58._0_4_;
              auVar70._4_4_ = tray.rdir.field_0._20_4_ * auVar58._4_4_;
              auVar70._8_4_ = tray.rdir.field_0._24_4_ * auVar58._8_4_;
              auVar70._12_4_ = tray.rdir.field_0._28_4_ * auVar58._12_4_;
              uVar29 = *(undefined4 *)(root.ptr + 0x70 + lVar30 * 4);
              auVar51._4_4_ = uVar29;
              auVar51._0_4_ = uVar29;
              auVar51._8_4_ = uVar29;
              auVar51._12_4_ = uVar29;
              auVar58 = vsubps_avx(auVar51,auVar23);
              auVar74._0_4_ = tray.rdir.field_0._32_4_ * auVar58._0_4_;
              auVar74._4_4_ = tray.rdir.field_0._36_4_ * auVar58._4_4_;
              auVar74._8_4_ = tray.rdir.field_0._40_4_ * auVar58._8_4_;
              auVar74._12_4_ = tray.rdir.field_0._44_4_ * auVar58._12_4_;
              auVar58 = vpminsd_avx(auVar88,auVar64);
              auVar41 = vpminsd_avx(auVar93,auVar70);
              auVar58 = vpmaxsd_avx(auVar58,auVar41);
              auVar41 = vpminsd_avx(auVar101,auVar74);
              auVar41 = vpmaxsd_avx(auVar58,auVar41);
              auVar58 = vpmaxsd_avx(auVar88,auVar64);
              auVar53 = vpmaxsd_avx(auVar93,auVar70);
              auVar53 = vpminsd_avx(auVar58,auVar53);
              auVar58 = vpmaxsd_avx(auVar101,auVar74);
              auVar53 = vpminsd_avx(auVar53,auVar58);
              auVar58 = vpmaxsd_avx(auVar41,(undefined1  [16])tray.tnear.field_0);
              auVar53 = vpminsd_avx(auVar53,(undefined1  [16])tray.tfar.field_0);
              auVar58 = vcmpps_avx(auVar58,auVar53,2);
              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar58[0xf]) {
                auVar60 = ZEXT1664(auVar52);
                sVar32 = sVar33;
              }
              else {
                auVar58 = vblendvps_avx(auVar104._0_16_,auVar41,auVar58);
                auVar60 = ZEXT1664(auVar58);
                if (sVar33 != 8) {
                  pNVar36->ptr = sVar33;
                  pNVar36 = pNVar36 + 1;
                  *(undefined1 (*) [16])paVar38->v = auVar52;
                  paVar38 = paVar38 + 1;
                }
              }
              lVar30 = lVar30 + 1;
              auVar52 = auVar60._0_16_;
              sVar33 = sVar32;
            } while (lVar30 != 4);
            iVar28 = 4;
            if (sVar32 == 8) goto LAB_01519de3;
            auVar52 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar60._0_16_,6);
            uVar29 = vmovmskps_avx(auVar52);
            root.ptr = sVar32;
          } while ((byte)uVar34 < (byte)POPCOUNT(uVar29));
          pNVar36->ptr = sVar32;
          pNVar36 = pNVar36 + 1;
          *paVar38 = auVar60._0_16_;
          paVar38 = paVar38 + 1;
        }
        else {
          do {
            sVar33 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> sVar33 & 1) == 0; sVar33 = sVar33 + 1) {
              }
            }
            auVar108 = ZEXT1664(auVar108._0_16_);
            bVar39 = occluded1(local_1940,local_1948,root,sVar33,&pre,ray,&tray,context);
            if (bVar39) {
              terminated.field_0.i[sVar33] = -1;
            }
            uVar37 = uVar37 & uVar37 - 1;
          } while (uVar37 != 0);
          auVar52 = vpcmpeqd_avx(auVar108._0_16_,auVar108._0_16_);
          auVar108 = ZEXT1664(auVar52);
          auVar52 = auVar52 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar52[0xf]) {
            iVar28 = 3;
          }
          else {
            auVar52._8_4_ = 0xff800000;
            auVar52._0_8_ = 0xff800000ff800000;
            auVar52._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar52,
                               (undefined1  [16])terminated.field_0);
            iVar28 = 2;
          }
          auVar104 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar60 = ZEXT1664((undefined1  [16])vVar4.field_0);
          if (uVar34 < uVar27) goto LAB_01519c56;
        }
LAB_01519de3:
      } while ((iVar28 == 4) || (iVar28 == 2));
LAB_0151a563:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar59._8_4_ = 0xff800000;
      auVar59._0_8_ = 0xff800000ff800000;
      auVar59._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar59);
      *(undefined1 (*) [16])pRVar1 = auVar8;
    }
  }
  return;
  while( true ) {
    uVar35 = uVar35 + 1;
    lVar30 = lVar30 + 0xb0;
    auVar53 = auVar58;
    if (uVar37 - 8 <= uVar35) break;
LAB_01519e4d:
    uVar31 = 0;
    auVar52 = auVar53;
    while( true ) {
      uVar27 = *(uint *)(lVar30 + -0x10 + uVar31 * 4);
      if ((ulong)uVar27 == 0xffffffff) break;
      uVar29 = *(undefined4 *)(lVar30 + -0xa0 + uVar31 * 4);
      auVar54._4_4_ = uVar29;
      auVar54._0_4_ = uVar29;
      auVar54._8_4_ = uVar29;
      auVar54._12_4_ = uVar29;
      uVar29 = *(undefined4 *)(lVar30 + -0x90 + uVar31 * 4);
      auVar65._4_4_ = uVar29;
      auVar65._0_4_ = uVar29;
      auVar65._8_4_ = uVar29;
      auVar65._12_4_ = uVar29;
      uVar29 = *(undefined4 *)(lVar30 + -0x80 + uVar31 * 4);
      auVar71._4_4_ = uVar29;
      auVar71._0_4_ = uVar29;
      auVar71._8_4_ = uVar29;
      auVar71._12_4_ = uVar29;
      fVar45 = *(float *)(lVar30 + -0x70 + uVar31 * 4);
      fVar61 = *(float *)(lVar30 + -0x60 + uVar31 * 4);
      fVar62 = *(float *)(lVar30 + -0x50 + uVar31 * 4);
      fVar63 = *(float *)(lVar30 + -0x40 + uVar31 * 4);
      fVar2 = *(float *)(lVar30 + -0x30 + uVar31 * 4);
      fVar3 = *(float *)(lVar30 + -0x20 + uVar31 * 4);
      auVar58 = vsubps_avx(auVar54,*(undefined1 (*) [16])ray);
      auVar41 = vsubps_avx(auVar65,*(undefined1 (*) [16])(ray + 0x10));
      auVar79 = vsubps_avx(auVar71,*(undefined1 (*) [16])(ray + 0x20));
      fVar9 = *(float *)(ray + 0x50);
      fVar10 = *(float *)(ray + 0x54);
      fVar11 = *(float *)(ray + 0x58);
      fVar12 = *(float *)(ray + 0x5c);
      fVar13 = *(float *)(ray + 0x60);
      fVar14 = *(float *)(ray + 100);
      fVar15 = *(float *)(ray + 0x68);
      fVar16 = *(float *)(ray + 0x6c);
      fVar92 = auVar79._0_4_;
      auVar99._0_4_ = fVar92 * fVar9;
      fVar95 = auVar79._4_4_;
      auVar99._4_4_ = fVar95 * fVar10;
      fVar96 = auVar79._8_4_;
      auVar99._8_4_ = fVar96 * fVar11;
      fVar97 = auVar79._12_4_;
      auVar99._12_4_ = fVar97 * fVar12;
      fVar78 = auVar41._0_4_;
      auVar109._0_4_ = fVar78 * fVar13;
      fVar82 = auVar41._4_4_;
      auVar109._4_4_ = fVar82 * fVar14;
      fVar83 = auVar41._8_4_;
      auVar109._8_4_ = fVar83 * fVar15;
      fVar84 = auVar41._12_4_;
      auVar109._12_4_ = fVar84 * fVar16;
      auVar73 = vsubps_avx(auVar109,auVar99);
      fVar17 = *(float *)(ray + 0x40);
      fVar18 = *(float *)(ray + 0x44);
      fVar19 = *(float *)(ray + 0x48);
      fVar20 = *(float *)(ray + 0x4c);
      fVar40 = auVar58._0_4_;
      auVar110._0_4_ = fVar40 * fVar13;
      fVar42 = auVar58._4_4_;
      auVar110._4_4_ = fVar42 * fVar14;
      fVar43 = auVar58._8_4_;
      auVar110._8_4_ = fVar43 * fVar15;
      fVar44 = auVar58._12_4_;
      auVar110._12_4_ = fVar44 * fVar16;
      auVar111._0_4_ = fVar92 * fVar17;
      auVar111._4_4_ = fVar95 * fVar18;
      auVar111._8_4_ = fVar96 * fVar19;
      auVar111._12_4_ = fVar97 * fVar20;
      auVar69 = vsubps_avx(auVar111,auVar110);
      auVar112._0_4_ = fVar17 * fVar78;
      auVar112._4_4_ = fVar18 * fVar82;
      auVar112._8_4_ = fVar19 * fVar83;
      auVar112._12_4_ = fVar20 * fVar84;
      auVar75._0_4_ = fVar40 * fVar9;
      auVar75._4_4_ = fVar42 * fVar10;
      auVar75._8_4_ = fVar43 * fVar11;
      auVar75._12_4_ = fVar44 * fVar12;
      auVar80 = vsubps_avx(auVar75,auVar112);
      auVar58 = ZEXT416((uint)(fVar3 * fVar45 - fVar63 * fVar62));
      auVar41 = vshufps_avx(auVar58,auVar58,0);
      auVar58 = ZEXT416((uint)(fVar63 * fVar61 - fVar2 * fVar45));
      auVar79 = vshufps_avx(auVar58,auVar58,0);
      auVar85 = vpermilps_avx(ZEXT416((uint)(fVar2 * fVar62 - fVar3 * fVar61)),0);
      auVar55._0_4_ = fVar17 * auVar85._0_4_ + auVar41._0_4_ * fVar9 + auVar79._0_4_ * fVar13;
      auVar55._4_4_ = fVar18 * auVar85._4_4_ + auVar41._4_4_ * fVar10 + auVar79._4_4_ * fVar14;
      auVar55._8_4_ = fVar19 * auVar85._8_4_ + auVar41._8_4_ * fVar11 + auVar79._8_4_ * fVar15;
      auVar55._12_4_ = fVar20 * auVar85._12_4_ + auVar41._12_4_ * fVar12 + auVar79._12_4_ * fVar16;
      auVar100._8_4_ = 0x80000000;
      auVar100._0_8_ = 0x8000000080000000;
      auVar100._12_4_ = 0x80000000;
      auVar58 = vandps_avx(auVar100,auVar55);
      uVar103 = auVar58._0_4_;
      auVar102._0_4_ =
           uVar103 ^ (uint)(fVar63 * auVar73._0_4_ + fVar2 * auVar69._0_4_ + fVar3 * auVar80._0_4_);
      uVar105 = auVar58._4_4_;
      auVar102._4_4_ =
           uVar105 ^ (uint)(fVar63 * auVar73._4_4_ + fVar2 * auVar69._4_4_ + fVar3 * auVar80._4_4_);
      uVar106 = auVar58._8_4_;
      auVar102._8_4_ =
           uVar106 ^ (uint)(fVar63 * auVar73._8_4_ + fVar2 * auVar69._8_4_ + fVar3 * auVar80._8_4_);
      uVar107 = auVar58._12_4_;
      auVar102._12_4_ =
           uVar107 ^ (uint)(fVar63 * auVar73._12_4_ +
                           fVar2 * auVar69._12_4_ + fVar3 * auVar80._12_4_);
      auVar58 = vcmpps_avx(auVar102,_DAT_01f7aa10,5);
      auVar86 = auVar52 & auVar58;
      if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar86[0xf])
      {
LAB_01519fab:
        auVar7._8_8_ = uVar25;
        auVar7._0_8_ = uVar24;
      }
      else {
        auVar58 = vandps_avx(auVar58,auVar52);
        auVar81._0_4_ =
             uVar103 ^ (uint)(auVar73._0_4_ * fVar45 +
                             auVar69._0_4_ * fVar61 + auVar80._0_4_ * fVar62);
        auVar81._4_4_ =
             uVar105 ^ (uint)(auVar73._4_4_ * fVar45 +
                             auVar69._4_4_ * fVar61 + auVar80._4_4_ * fVar62);
        auVar81._8_4_ =
             uVar106 ^ (uint)(auVar73._8_4_ * fVar45 +
                             auVar69._8_4_ * fVar61 + auVar80._8_4_ * fVar62);
        auVar81._12_4_ =
             uVar107 ^ (uint)(auVar73._12_4_ * fVar45 +
                             auVar69._12_4_ * fVar61 + auVar80._12_4_ * fVar62);
        auVar73 = vcmpps_avx(auVar81,_DAT_01f7aa10,5);
        auVar69 = auVar58 & auVar73;
        local_1938 = auVar55;
        if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar69[0xf]
           ) goto LAB_01519fab;
        auVar76._8_4_ = 0x7fffffff;
        auVar76._0_8_ = 0x7fffffff7fffffff;
        auVar76._12_4_ = 0x7fffffff;
        auVar69 = vandps_avx(auVar76,auVar55);
        auVar73 = vandps_avx(auVar58,auVar73);
        auVar58 = vsubps_avx(auVar69,auVar102);
        auVar58 = vcmpps_avx(auVar58,auVar81,5);
        auVar80 = auVar73 & auVar58;
        if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar80[0xf]
           ) goto LAB_01519fab;
        auVar73 = vandps_avx(auVar58,auVar73);
        auVar77._0_4_ =
             uVar103 ^ (uint)(auVar85._0_4_ * fVar40 +
                             fVar78 * auVar41._0_4_ + auVar79._0_4_ * fVar92);
        auVar77._4_4_ =
             uVar105 ^ (uint)(auVar85._4_4_ * fVar42 +
                             fVar82 * auVar41._4_4_ + auVar79._4_4_ * fVar95);
        auVar77._8_4_ =
             uVar106 ^ (uint)(auVar85._8_4_ * fVar43 +
                             fVar83 * auVar41._8_4_ + auVar79._8_4_ * fVar96);
        auVar77._12_4_ =
             uVar107 ^ (uint)(auVar85._12_4_ * fVar44 +
                             fVar84 * auVar41._12_4_ + auVar79._12_4_ * fVar97);
        auVar89._0_4_ = auVar69._0_4_ * *(float *)(ray + 0x30);
        auVar89._4_4_ = auVar69._4_4_ * *(float *)(ray + 0x34);
        auVar89._8_4_ = auVar69._8_4_ * *(float *)(ray + 0x38);
        auVar89._12_4_ = auVar69._12_4_ * *(float *)(ray + 0x3c);
        auVar94._0_4_ = auVar69._0_4_ * *(float *)(ray + 0x80);
        auVar94._4_4_ = auVar69._4_4_ * *(float *)(ray + 0x84);
        auVar94._8_4_ = auVar69._8_4_ * *(float *)(ray + 0x88);
        auVar94._12_4_ = auVar69._12_4_ * *(float *)(ray + 0x8c);
        auVar80 = vcmpps_avx(auVar89,auVar77,1);
        auVar86 = vcmpps_avx(auVar77,auVar94,2);
        auVar80 = vandps_avx(auVar86,auVar80);
        auVar86 = auVar73 & auVar80;
        if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar86[0xf]
           ) {
LAB_0151a423:
          auVar7._8_8_ = uVar25;
          auVar7._0_8_ = uVar24;
        }
        else {
          auVar73 = vandps_avx(auVar80,auVar73);
          auVar80 = vcmpps_avx(auVar55,_DAT_01f7aa10,4);
          auVar86 = auVar73 & auVar80;
          if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar86[0xf]) goto LAB_0151a423;
          auVar7 = vandps_avx(auVar80,auVar73);
          local_17f8 = auVar79;
          local_17e8 = auVar41;
          local_17d8 = auVar85;
          local_17c8 = auVar69;
          _local_17b8 = auVar77;
          _local_17a8 = auVar81;
          _local_1798 = auVar102;
        }
      }
      pGVar5 = (context->scene->geometries).items[uVar27].ptr;
      uVar103 = pGVar5->mask;
      auVar56._4_4_ = uVar103;
      auVar56._0_4_ = uVar103;
      auVar56._8_4_ = uVar103;
      auVar56._12_4_ = uVar103;
      auVar41 = vandps_avx(auVar56,*(undefined1 (*) [16])(ray + 0x90));
      auVar41 = vpcmpeqd_avx(auVar41,_DAT_01f7aa10);
      auVar79 = auVar7 & ~auVar41;
      auVar104 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar58 = vpcmpeqd_avx(auVar58,auVar58);
      auVar108 = ZEXT1664(auVar58);
      if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar79[0xf] < '\0'
         ) {
        auVar41 = vandnps_avx(auVar41,auVar7);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar79 = vrcpps_avx(local_17c8);
          fVar45 = auVar79._0_4_;
          auVar66._0_4_ = local_17c8._0_4_ * fVar45;
          fVar61 = auVar79._4_4_;
          auVar66._4_4_ = local_17c8._4_4_ * fVar61;
          fVar62 = auVar79._8_4_;
          auVar66._8_4_ = local_17c8._8_4_ * fVar62;
          fVar63 = auVar79._12_4_;
          auVar66._12_4_ = local_17c8._12_4_ * fVar63;
          auVar72._8_4_ = 0x3f800000;
          auVar72._0_8_ = 0x3f8000003f800000;
          auVar72._12_4_ = 0x3f800000;
          auVar79 = vsubps_avx(auVar72,auVar66);
          fVar45 = fVar45 + fVar45 * auVar79._0_4_;
          fVar61 = fVar61 + fVar61 * auVar79._4_4_;
          fVar62 = fVar62 + fVar62 * auVar79._8_4_;
          fVar63 = fVar63 + fVar63 * auVar79._12_4_;
          local_1738 = fVar45 * (float)local_1798._0_4_;
          fStack_1734 = fVar61 * (float)local_1798._4_4_;
          fStack_1730 = fVar62 * fStack_1790;
          fStack_172c = fVar63 * fStack_178c;
          local_1728 = fVar45 * (float)local_17a8._0_4_;
          fStack_1724 = fVar61 * (float)local_17a8._4_4_;
          fStack_1720 = fVar62 * fStack_17a0;
          fStack_171c = fVar63 * fStack_179c;
          local_1708 = vpshufd_avx(ZEXT416(uVar27),0);
          local_1718 = vpshufd_avx(ZEXT416(*(uint *)(lVar30 + uVar31 * 4)),0);
          local_1768 = local_17d8._0_8_;
          uStack_1760 = local_17d8._8_8_;
          local_1758 = local_17e8._0_8_;
          uStack_1750 = local_17e8._8_8_;
          local_1748 = local_17f8;
          auVar57._0_4_ = fVar45 * (float)local_17b8._0_4_;
          auVar57._4_4_ = fVar61 * (float)local_17b8._4_4_;
          auVar57._8_4_ = fVar62 * fStack_17b0;
          auVar57._12_4_ = fVar63 * fStack_17ac;
          vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          auStack_16e8._4_4_ = context->user->instPrimID[0];
          auStack_16e8._0_4_ = auStack_16e8._4_4_;
          auStack_16e8._8_4_ = auStack_16e8._4_4_;
          auStack_16e8._12_4_ = auStack_16e8._4_4_;
          auVar79 = *(undefined1 (*) [16])(ray + 0x80);
          auVar73 = vblendvps_avx(auVar79,auVar57,auVar41);
          *(undefined1 (*) [16])(ray + 0x80) = auVar73;
          args.valid = (int *)local_1958;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_1958 = auVar41;
          args.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
            auVar104 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1958 == (undefined1  [16])0x0) {
            auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar58 = vpcmpeqd_avx(auVar58,auVar58);
            auVar108 = ZEXT1664(auVar58);
            auVar58 = auVar58 ^ auVar41;
          }
          else {
            p_Var6 = context->args->filter;
            auVar58 = vpcmpeqd_avx(auVar58,auVar58);
            auVar108 = ZEXT1664(auVar58);
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&args);
              auVar58 = vpcmpeqd_avx(auVar58,auVar58);
              auVar108 = ZEXT1664(auVar58);
              auVar104 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar41 = vpcmpeqd_avx(local_1958,_DAT_01f7aa10);
            auVar58 = auVar108._0_16_ ^ auVar41;
            auVar67._8_4_ = 0xff800000;
            auVar67._0_8_ = 0xff800000ff800000;
            auVar67._12_4_ = 0xff800000;
            auVar41 = vblendvps_avx(auVar67,*(undefined1 (*) [16])(args.ray + 0x80),auVar41);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar41;
          }
          auVar58 = vpslld_avx(auVar58,0x1f);
          auVar41 = vpsrad_avx(auVar58,0x1f);
          auVar58 = vblendvps_avx(auVar79,*(undefined1 (*) [16])pRVar1,auVar58);
          *(undefined1 (*) [16])pRVar1 = auVar58;
        }
        auVar52 = vpandn_avx(auVar41,auVar52);
      }
      if (((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar52[0xf])
         || (bVar39 = 2 < uVar31, uVar31 = uVar31 + 1, bVar39)) break;
    }
    auVar58 = vandps_avx(auVar52,auVar53);
    auVar53 = auVar53 & auVar52;
    if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar53[0xf])
    break;
  }
  terminated.field_0.i[0] = auVar108._0_4_ ^ auVar58._0_4_;
  terminated.field_0.i[1] = auVar108._4_4_ ^ auVar58._4_4_;
  terminated.field_0.i[2] = auVar108._8_4_ ^ auVar58._8_4_;
  terminated.field_0.i[3] = auVar108._12_4_ ^ auVar58._12_4_;
LAB_0151a460:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])vVar26.field_0,(undefined1  [16])terminated.field_0);
  auVar52 = auVar108._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar52[0xf])
  goto LAB_0151a563;
  auVar68._8_4_ = 0xff800000;
  auVar68._0_8_ = 0xff800000ff800000;
  auVar68._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar68,
                     (undefined1  [16])terminated.field_0);
  goto LAB_01519c16;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }